

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_free(ptls_t *tls)

{
  _func_int_st_ptls_key_exchange_context_t_ptr_ptr_int_ptls_iovec_t_ptr_ptls_iovec_t *p_Var1;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var2;
  void *pvVar3;
  ptls_iovec_t pVar4;
  ptls_iovec_t pVar5;
  ptls_t *tls_local;
  
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  ptls_buffer_dispose(&(tls->recvbuf).mess);
  free_exporter_master_secret(tls,1);
  free_exporter_master_secret(tls,0);
  if (tls->esni != (ptls_esni_secret_t *)0x0) {
    free_esni_secret(&tls->esni,(uint)(tls->field_0x160 & 1));
  }
  if (tls->key_schedule != (ptls_key_schedule_t *)0x0) {
    key_schedule_free(tls->key_schedule);
  }
  if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
    ptls_aead_free((tls->traffic_protection).dec.aead);
  }
  if ((tls->traffic_protection).enc.aead != (ptls_aead_context_t *)0x0) {
    ptls_aead_free((tls->traffic_protection).enc.aead);
  }
  free(tls->server_name);
  free(tls->negotiated_protocol);
  if ((tls->field_0x160 & 1) == 0) {
    if ((tls->field_18).client.key_share_ctx != (ptls_key_exchange_context_t *)0x0) {
      p_Var1 = ((tls->field_18).client.key_share_ctx)->on_exchange;
      pVar4 = ptls_iovec_init((void *)0x0,0);
      (*p_Var1)(&(tls->field_18).client.key_share_ctx,1,(ptls_iovec_t *)0x0,pVar4);
    }
    if ((tls->field_18).client.certificate_request.context.base != (uint8_t *)0x0) {
      free((tls->field_18).client.certificate_request.context.base);
    }
  }
  if ((tls->certificate_verify).cb != (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
    p_Var2 = (tls->certificate_verify).cb;
    pvVar3 = (tls->certificate_verify).verify_ctx;
    pVar4 = ptls_iovec_init((void *)0x0,0);
    pVar5 = ptls_iovec_init((void *)0x0,0);
    (*p_Var2)(pvVar3,pVar4,pVar5);
  }
  if (tls->pending_handshake_secret != (uint8_t *)0x0) {
    (*ptls_clear_memory)(tls->pending_handshake_secret,0x40);
    free(tls->pending_handshake_secret);
  }
  update_open_count(tls->ctx,-1);
  (*ptls_clear_memory)(tls,0x200);
  free(tls);
  return;
}

Assistant:

void ptls_free(ptls_t *tls)
{
    PTLS_PROBE0(FREE, tls);
    ptls_buffer_dispose(&tls->recvbuf.rec);
    ptls_buffer_dispose(&tls->recvbuf.mess);
    free_exporter_master_secret(tls, 1);
    free_exporter_master_secret(tls, 0);
    if (tls->esni != NULL)
        free_esni_secret(&tls->esni, tls->is_server);
    if (tls->key_schedule != NULL)
        key_schedule_free(tls->key_schedule);
    if (tls->traffic_protection.dec.aead != NULL)
        ptls_aead_free(tls->traffic_protection.dec.aead);
    if (tls->traffic_protection.enc.aead != NULL)
        ptls_aead_free(tls->traffic_protection.enc.aead);
    free(tls->server_name);
    free(tls->negotiated_protocol);
    if (tls->is_server) {
        /* nothing to do */
    } else {
        if (tls->client.key_share_ctx != NULL)
            tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, NULL, ptls_iovec_init(NULL, 0));
        if (tls->client.certificate_request.context.base != NULL)
            free(tls->client.certificate_request.context.base);
    }
    if (tls->certificate_verify.cb != NULL) {
        tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, ptls_iovec_init(NULL, 0), ptls_iovec_init(NULL, 0));
    }
    if (tls->pending_handshake_secret != NULL) {
        ptls_clear_memory(tls->pending_handshake_secret, PTLS_MAX_DIGEST_SIZE);
        free(tls->pending_handshake_secret);
    }
    update_open_count(tls->ctx, -1);
    ptls_clear_memory(tls, sizeof(*tls));
    free(tls);
}